

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O0

void __thiscall POSG::POSG(POSG *this,void **vtt)

{
  long *in_RSI;
  long *in_RDI;
  
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x78)) = in_RSI[1];
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x40)) = in_RSI[2];
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0xada949);
  std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::vector
            ((vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> *)0xada956);
  *(undefined1 *)(in_RDI + 1) = 0;
  in_RDI[2] = 0;
  return;
}

Assistant:

POSG::POSG() 
{
    _m_initialized = false;
    _m_nrAgents = 0;
    //we can not call GetNrAgents from here...
    //instead this object will have to have the number of agents set and be
    //initialized.
    //_m_rewardType = vector<double>(GetNrAgents(), REWARD);
    //_m_discount = vector<double>(GetNrAgents(), 1.0);
}